

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertFloatsWithin(_UF delta,_UF expected,_UF actual,char *msg,_U_UINT lineNumber)

{
  int iVar1;
  int iVar2;
  float local_30;
  float local_2c;
  _UF pos_delta;
  _UF diff;
  _U_UINT lineNumber_local;
  char *msg_local;
  _UF actual_local;
  _UF expected_local;
  _UF delta_local;
  
  local_2c = actual - expected;
  if ((Unity.CurrentTestFailed != 0) || (Unity.CurrentTestIgnored != 0)) {
    return;
  }
  if (local_2c < 0.0) {
    local_2c = 0.0 - local_2c;
  }
  local_30 = delta;
  if (delta < 0.0) {
    local_30 = 0.0 - delta;
  }
  if (!NAN(local_2c)) {
    iVar2 = 1;
    if ((int)local_2c < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(local_2c) == INFINITY) {
      iVar1 = iVar2;
    }
    if ((iVar1 == 0) && (local_2c <= local_30)) {
      return;
    }
  }
  UnityTestResultsFailBegin(lineNumber);
  UnityPrint(" Values Not Within Delta ");
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertFloatsWithin(const _UF delta,
                             const _UF expected,
                             const _UF actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber)
{
    _UF diff = actual - expected;
    _UF pos_delta = delta;

    UNITY_SKIP_EXECUTION;

    if (diff < 0.0f)
    {
        diff = 0.0f - diff;
    }
    if (pos_delta < 0.0f)
    {
        pos_delta = 0.0f - pos_delta;
    }

    /* This first part of this condition will catch any NaN or Infinite values */
    if (isnan(diff) || isinf(diff) || (pos_delta < diff))
    {
        UnityTestResultsFailBegin(lineNumber);
#ifdef UNITY_FLOAT_VERBOSE
        UnityPrint(UnityStrExpected);
        UnityPrintFloat(expected);
        UnityPrint(UnityStrWas);
        UnityPrintFloat(actual);
#else
        UnityPrint(UnityStrDelta);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}